

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

void Abc_SclBufSize(Bus_Man_t *p,float Gain)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  SC_Cell *pCell_00;
  abctime aVar10;
  float fVar11;
  double dVar12;
  bool local_a6;
  float local_a4;
  float local_98;
  float local_94;
  SC_Pair local_90;
  SC_Pair LoadIn;
  SC_Pair SlewOut;
  SC_Pair ArrOut;
  float Load_1;
  float DeptCur;
  Abc_Obj_t *pInv;
  float local_60;
  float DeptMax;
  float Cin;
  float LoadNew;
  float Load;
  float GainInv;
  float GainGate;
  int nObjsOld;
  int k;
  int i;
  abctime clk;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  SC_Cell *pCellNew;
  SC_Cell *pCell;
  float Gain_local;
  Bus_Man_t *p_local;
  
  aVar7 = Abc_Clock();
  iVar5 = Abc_NtkObjNumMax(p->pNtk);
  pInv._4_4_ = 0.0;
  local_94 = Gain;
  if (p->pPars->fAddBufs != 0) {
    dVar12 = pow((double)Gain,2.0);
    local_94 = (float)dVar12;
  }
  local_98 = Gain;
  if (p->pPars->fAddBufs != 0) {
    dVar12 = pow((double)Gain,2.0);
    local_98 = (float)dVar12;
  }
  nObjsOld = Vec_PtrSize(p->pNtk->vObjs);
  do {
    do {
      nObjsOld = nObjsOld + -1;
      if (nObjsOld < 0) {
LAB_00532187:
        if (nObjsOld < 0) {
          for (nObjsOld = 0; iVar6 = Abc_NtkCiNum(p->pNtk), nObjsOld < iVar6;
              nObjsOld = nObjsOld + 1) {
            pAVar8 = Abc_NtkCi(p->pNtk,nObjsOld);
            ArrOut.fall = Abc_NtkComputeNodeDeparture(pAVar8,(float)p->pPars->Slew);
            if (p->pPiDrive != (SC_Cell *)0x0) {
              local_90.rise = Bus_SclObjLoad(pAVar8);
              local_90.fall = local_90.rise;
              Scl_LibHandleInputDriver(p->pPiDrive,&local_90,&SlewOut,&LoadIn);
              ArrOut.fall = ArrOut.fall + SlewOut.fall * 0.5 + SlewOut.rise * 0.5;
            }
            pInv._4_4_ = Abc_MaxFloat(pInv._4_4_,ArrOut.fall);
          }
        }
        if (p->pPars->fVerbose != 0) {
          uVar1 = p->pPars->fUseWireLoads;
          uVar2 = p->pPars->nDegree;
          uVar3 = p->pPars->Slew;
          uVar4 = p->pPars->GainRatio;
          iVar6 = Abc_NtkObjNumMax(p->pNtk);
          printf("WireLoads = %d  Degree = %d  Target slew =%4d ps   Gain2 =%5d  Buf = %6d  Delay =%7.0f ps   "
                 ,(double)pInv._4_4_,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                 (ulong)(uint)(iVar6 - iVar5));
          aVar10 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar10 - aVar7);
        }
        return;
      }
      pAVar8 = Abc_NtkObj(p->pNtk,nObjsOld);
    } while ((pAVar8 == (Abc_Obj_t *)0x0) ||
            (((iVar6 = Abc_ObjIsNode(pAVar8), iVar6 == 0 ||
              (iVar6 = Abc_ObjFaninNum(pAVar8), iVar6 < 1)) &&
             ((iVar6 = Abc_ObjIsCi(pAVar8), iVar6 == 0 || (p->pPiDrive == (SC_Cell *)0x0))))));
    iVar6 = Abc_NtkObjNumMax(p->pNtk);
    if (iVar5 << 1 < iVar6) {
      printf("Buffering could not be completed because the gain value (%d) is too low.\n",
             (ulong)(uint)p->pPars->GainRatio);
      goto LAB_00532187;
    }
    Abc_NtkComputeFanoutInfo(pAVar8,(float)p->pPars->Slew);
    Cin = Abc_NtkComputeNodeLoad(p,pAVar8);
    iVar6 = Abc_ObjIsCi(pAVar8);
    if ((iVar6 == 0) && (iVar6 = Abc_ObjIsBarBuf(pAVar8), iVar6 == 0)) {
      pCellNew = Abc_SclObjCell(pAVar8);
      local_60 = SC_CellPinCapAve(pCellNew->pAve);
    }
    else {
      pCellNew = p->pPiDrive;
      local_a4 = Cin;
      if (pCellNew != (SC_Cell *)0x0) {
        local_a4 = SC_CellPinCapAve(pCellNew);
      }
      local_60 = local_a4;
    }
    if ((p->pPars->fSizeOnly == 0) &&
       ((iVar6 = Abc_ObjFanoutNum(pAVar8), p->pPars->nDegree < iVar6 || (local_94 * local_60 < Cin))
       )) {
      Abc_NodeCollectFanouts(pAVar8,p->vFanouts);
      Vec_PtrSort(p->vFanouts,Bus_SclCompareFanouts);
      do {
        if (p->pPars->fVeryVerbose != 0) {
          Abc_NtkPrintFanoutProfileVec(pAVar8,p->vFanouts);
        }
        pAVar9 = Abc_SclAddOneInv(p,pAVar8,p->vFanouts,local_98);
        if (p->pPars->fVeryVerbose != 0) {
          Abc_SclOneNodePrint(p,pAVar9);
        }
        Bus_SclInsertFanout(p->vFanouts,pAVar9);
        Cin = Abc_NtkComputeFanoutLoad(p,p->vFanouts);
        iVar6 = Vec_PtrSize(p->vFanouts);
        local_a6 = true;
        if (iVar6 <= p->pPars->nDegree) {
          iVar6 = Vec_PtrSize(p->vFanouts);
          local_a6 = 1 < iVar6 && local_94 * local_60 < Cin;
        }
      } while (local_a6);
      for (GainGate = 0.0; iVar6 = Vec_PtrSize(p->vFanouts), (int)GainGate < iVar6;
          GainGate = (float)((int)GainGate + 1)) {
        pAVar9 = (Abc_Obj_t *)Vec_PtrEntry(p->vFanouts,(int)GainGate);
        iVar6 = Abc_ObjFaninNum(pAVar9);
        if (iVar6 == 0) {
          Abc_ObjAddFanin(pAVar9,pAVar8);
        }
      }
      Bus_SclObjSetLoad(pAVar8,0.0);
      fVar11 = Abc_NtkComputeNodeLoad(p,pAVar8);
      if ((1.0 <= fVar11 - Cin) || (1.0 <= Cin - fVar11)) {
        __assert_fail("LoadNew - Load < 1 && Load - LoadNew < 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                      ,0x1c9,"void Abc_SclBufSize(Bus_Man_t *, float)");
      }
    }
    iVar6 = Abc_ObjIsCi(pAVar8);
    if (iVar6 == 0) {
      Abc_NtkComputeNodeDeparture(pAVar8,(float)p->pPars->Slew);
      iVar6 = Abc_ObjIsBarBuf(pAVar8);
      if (iVar6 == 0) {
        pCell_00 = Abc_SclFindSmallestGate(pCellNew,Cin / local_94);
        Abc_SclObjSetCell(pAVar8,pCell_00);
        if (p->pPars->fVeryVerbose != 0) {
          Abc_SclOneNodePrint(p,pAVar8);
        }
        if ((p->pPars->fSizeOnly == 0) &&
           (iVar6 = Abc_ObjFanoutNum(pAVar8), p->pPars->nDegree < iVar6)) {
          __assert_fail("p->pPars->fSizeOnly || Abc_ObjFanoutNum(pObj) <= p->pPars->nDegree",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                        ,0x1d5,"void Abc_SclBufSize(Bus_Man_t *, float)");
        }
      }
    }
  } while( true );
}

Assistant:

void Abc_SclBufSize( Bus_Man_t * p, float Gain )
{
    SC_Cell * pCell, * pCellNew;
    Abc_Obj_t * pObj, * pFanout;
    abctime clk = Abc_Clock();
    int i, k, nObjsOld = Abc_NtkObjNumMax(p->pNtk);
    float GainGate, GainInv, Load, LoadNew, Cin, DeptMax = 0;
    GainGate = p->pPars->fAddBufs ? (float)pow( (double)Gain, (double)2.0 ) : Gain;
    GainInv  = p->pPars->fAddBufs ? (float)pow( (double)Gain, (double)2.0 ) : Gain;
    Abc_NtkForEachObjReverse( p->pNtk, pObj, i )
    {
        if ( !((Abc_ObjIsNode(pObj) && Abc_ObjFaninNum(pObj) > 0) || (Abc_ObjIsCi(pObj) && p->pPiDrive)) )
            continue;
        if ( 2 * nObjsOld < Abc_NtkObjNumMax(p->pNtk) )
        {
            printf( "Buffering could not be completed because the gain value (%d) is too low.\n", p->pPars->GainRatio );
            break;
        }
        // compute load
        Abc_NtkComputeFanoutInfo( pObj, p->pPars->Slew );
        Load = Abc_NtkComputeNodeLoad( p, pObj );
        // consider the gate
        if ( Abc_ObjIsCi(pObj) || Abc_ObjIsBarBuf(pObj) )
        {
            pCell = p->pPiDrive;
            // if PI driver is not given, assume Cin to be equal to Load
            // this way, buffering of the PIs is performed
            Cin = pCell ? SC_CellPinCapAve(pCell) : Load;
        }
        else
        {
            pCell = Abc_SclObjCell( pObj );
            Cin = SC_CellPinCapAve( pCell->pAve );
//        Cin = SC_CellPinCapAve( pCell->pRepr->pNext );
        }
        // consider buffering this gate
        if ( !p->pPars->fSizeOnly && (Abc_ObjFanoutNum(pObj) > p->pPars->nDegree || Load > GainGate * Cin) )
        {
            // add one or more inverters
//            Abc_NtkPrintFanoutProfile( pObj );
            Abc_NodeCollectFanouts( pObj, p->vFanouts );
            Vec_PtrSort( p->vFanouts, (int(*)(void))Bus_SclCompareFanouts );
            do 
            {
                Abc_Obj_t * pInv;
                if ( p->pPars->fVeryVerbose )//|| Vec_PtrSize(p->vFanouts) == Abc_ObjFanoutNum(pObj) )
                    Abc_NtkPrintFanoutProfileVec( pObj, p->vFanouts );
                pInv = Abc_SclAddOneInv( p, pObj, p->vFanouts, GainInv );
                if ( p->pPars->fVeryVerbose )
                    Abc_SclOneNodePrint( p, pInv );
                Bus_SclInsertFanout( p->vFanouts, pInv );
                Load = Abc_NtkComputeFanoutLoad( p, p->vFanouts );
            }
            while ( Vec_PtrSize(p->vFanouts) > p->pPars->nDegree || (Vec_PtrSize(p->vFanouts) > 1 && Load > GainGate * Cin) );
            // update node fanouts
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanouts, pFanout, k )
                if ( Abc_ObjFaninNum(pFanout) == 0 )
                    Abc_ObjAddFanin( pFanout, pObj );
            Bus_SclObjSetLoad( pObj, 0 );
            LoadNew = Abc_NtkComputeNodeLoad( p, pObj );
            assert( LoadNew - Load < 1 && Load - LoadNew < 1 );
        } 
        if ( Abc_ObjIsCi(pObj) )
            continue;
        Abc_NtkComputeNodeDeparture( pObj, p->pPars->Slew );
        if ( Abc_ObjIsBarBuf(pObj) )
            continue;
        // create cell
        pCellNew = Abc_SclFindSmallestGate( pCell, Load / GainGate );
        Abc_SclObjSetCell( pObj, pCellNew );
        if ( p->pPars->fVeryVerbose )
            Abc_SclOneNodePrint( p, pObj );
        assert( p->pPars->fSizeOnly || Abc_ObjFanoutNum(pObj) <= p->pPars->nDegree );
    }
    // compute departure time of the PI
    if ( i < 0 ) // finished buffering
    Abc_NtkForEachCi( p->pNtk, pObj, i )
    {
        float DeptCur = Abc_NtkComputeNodeDeparture(pObj, p->pPars->Slew);
        if ( p->pPiDrive )
        {
            float Load = Bus_SclObjLoad( pObj );
            SC_Pair ArrOut, SlewOut, LoadIn = { Load, Load }; 
            Scl_LibHandleInputDriver( p->pPiDrive, &LoadIn, &ArrOut, &SlewOut );
            DeptCur += 0.5 * ArrOut.fall +  0.5 * ArrOut.rise;
        }       
        DeptMax = Abc_MaxFloat( DeptMax, DeptCur );
    }
    if ( p->pPars->fVerbose )
    {
        printf( "WireLoads = %d  Degree = %d  Target slew =%4d ps   Gain2 =%5d  Buf = %6d  Delay =%7.0f ps   ", 
            p->pPars->fUseWireLoads, p->pPars->nDegree, p->pPars->Slew, p->pPars->GainRatio, 
            Abc_NtkObjNumMax(p->pNtk) - nObjsOld, DeptMax );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}